

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intel_edison_fab_c.c
# Opt level: O0

mraa_result_t mraa_intel_edison_mmap_write(mraa_gpio_context dev,int value)

{
  byte local_16;
  uint8_t valoff;
  uint8_t offset;
  int value_local;
  mraa_gpio_context dev_local;
  
  if (value == 0) {
    local_16 = 0x4c;
  }
  else {
    local_16 = 0x34;
  }
  *(int *)(mmap_reg +
          (long)(int)(uint)local_16 + (long)(int)(uint)(byte)((long)(dev->pin / 0x20) << 2)) =
       1 << ((byte)((long)dev->pin % 0x20) & 0x1f);
  return MRAA_SUCCESS;
}

Assistant:

mraa_result_t
mraa_intel_edison_mmap_write(mraa_gpio_context dev, int value)
{
    uint8_t offset = ((dev->pin / 32) * sizeof(uint32_t));
    uint8_t valoff;

    if (value) {
        valoff = 0x34;
    } else {
        valoff = 0x4c;
    }

    *(volatile uint32_t*) (mmap_reg + offset + valoff) = (uint32_t)(1 << (dev->pin % 32));

    return MRAA_SUCCESS;
}